

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O0

void CT_Drawer(void)

{
  char *string;
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  BYTE BVar3;
  int iVar4;
  int iVar5;
  AActor *pAVar6;
  bool bVar7;
  int local_3c;
  int local_28;
  int local_24;
  int st_y;
  int screen_height;
  int screen_width;
  int promptwidth;
  int y;
  int scalex;
  int x;
  int i;
  
  if (chatmodeon != 0) {
    screen_width = -0x1e;
    if (viewactive || gamestate != GS_LEVEL) {
      screen_width = -10;
    }
    iVar4 = active_con_scaletext();
    if (iVar4 == 0) {
      promptwidth = CleanXfac;
      screen_width = CleanYfac * screen_width;
    }
    else {
      promptwidth = 1;
    }
    iVar4 = active_con_scaletext();
    if (iVar4 == 0) {
      st_y = DCanvas::GetWidth((DCanvas *)screen);
      local_24 = DCanvas::GetHeight((DCanvas *)screen);
      local_28 = ST_Y;
    }
    else {
      iVar4 = DCanvas::GetWidth((DCanvas *)screen);
      iVar5 = active_con_scaletext();
      st_y = iVar4 / iVar5;
      local_24 = DCanvas::GetHeight((DCanvas *)screen);
      iVar4 = active_con_scaletext();
      local_28 = ST_Y;
      local_24 = local_24 / iVar4;
      iVar4 = active_con_scaletext();
      local_28 = local_28 / iVar4;
    }
    iVar4 = DCanvas::GetHeight((DCanvas *)screen);
    if (((iVar4 == viewheight) && ((viewactive & 1U) != 0)) || (gamestate != GS_LEVEL)) {
      local_3c = local_24;
    }
    else {
      local_3c = local_28;
    }
    local_3c = local_3c + screen_width;
    iVar5 = FFont::StringWidth(SmallFont,CT_Drawer::prompt);
    iVar5 = iVar5 * promptwidth;
    iVar4 = (*SmallFont->_vptr_FFont[3])(SmallFont,0x5f);
    y = iVar4 * promptwidth * 2 + iVar5;
    iVar4 = len;
    while (scalex = iVar4 + -1, -1 < scalex && y < st_y) {
      iVar4 = (*SmallFont->_vptr_FFont[3])(SmallFont,(ulong)(ChatQueue[scalex] & 0x7f));
      y = iVar4 * promptwidth + y;
      iVar4 = scalex;
    }
    bVar7 = scalex < 0;
    scalex = iVar4;
    if (bVar7) {
      scalex = 0;
    }
    BVar3 = FFont::GetCursor(SmallFont);
    ChatQueue[len] = BVar3;
    ChatQueue[len + 1] = '\0';
    iVar4 = active_con_scaletext();
    pDVar2 = screen;
    pFVar1 = SmallFont;
    string = CT_Drawer::prompt;
    if (iVar4 < 2) {
      iVar4 = active_con_scaletext();
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,3,0,local_3c,string,0x40001393,(uint)(iVar4 == 0),0
                       );
      pDVar2 = screen;
      pFVar1 = SmallFont;
      iVar4 = active_con_scaletext();
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,2,iVar5,local_3c,(char *)(ChatQueue + scalex),
                        0x40001393,(uint)(iVar4 == 0),0);
    }
    else {
      DCanvas::DrawText((DCanvas *)screen,SmallFont,3,0,local_3c,CT_Drawer::prompt,0x40001399,st_y,
                        0x4000139a,local_24,0x400013a8,1,0);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,2,iVar5,local_3c,(char *)(ChatQueue + scalex),
                        0x40001399,st_y,0x4000139a,local_24,0x400013a8,1,0);
    }
    ChatQueue[len] = '\0';
    BorderTopRefresh =
         (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
  }
  bVar7 = TObjPtr<AActor>::operator!=
                    ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0),(AActor *)0x0)
  ;
  if (((bVar7) &&
      (((Button_ShowScores.bDown != '\0' ||
        (pAVar6 = TObjPtr<AActor>::operator->
                            ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0)),
        pAVar6->health < 1)) || ((SB_ForceActive & 1U) != 0)))) && (gamestate != GS_INTERMISSION)) {
    HU_DrawScores((player_t *)(&players + (long)consoleplayer * 0x54));
  }
  return;
}

Assistant:

void CT_Drawer (void)
{
	if (chatmodeon)
	{
		static const char *prompt = "Say: ";
		int i, x, scalex, y, promptwidth;

		y = (viewactive || gamestate != GS_LEVEL) ? -10 : -30;
		if (active_con_scaletext() == 0)
		{
			scalex = CleanXfac;
			y *= CleanYfac;
		}
		else
		{
			scalex = 1;
		}

		int screen_width, screen_height, st_y;
		if (active_con_scaletext() == 0)
		{
			screen_width = SCREENWIDTH;
			screen_height = SCREENHEIGHT;
			st_y = ST_Y;
		}
		else
		{
			screen_width = SCREENWIDTH / active_con_scaletext();
			screen_height = SCREENHEIGHT / active_con_scaletext();
			st_y = ST_Y / active_con_scaletext();
		}

		y += ((SCREENHEIGHT == viewheight && viewactive) || gamestate != GS_LEVEL) ? screen_height : st_y;

		promptwidth = SmallFont->StringWidth (prompt) * scalex;
		x = SmallFont->GetCharWidth ('_') * scalex * 2 + promptwidth;

		// figure out if the text is wider than the screen->
		// if so, only draw the right-most portion of it.
		for (i = len - 1; i >= 0 && x < screen_width; i--)
		{
			x += SmallFont->GetCharWidth (ChatQueue[i] & 0x7f) * scalex;
		}

		if (i >= 0)
		{
			i++;
		}
		else
		{
			i = 0;
		}

		// draw the prompt, text, and cursor
		ChatQueue[len] = SmallFont->GetCursor();
		ChatQueue[len+1] = '\0';
		if (active_con_scaletext() < 2)
		{
			screen->DrawText (SmallFont, CR_GREEN, 0, y, prompt, DTA_CleanNoMove, active_con_scaletext() == 0, TAG_DONE);
			screen->DrawText (SmallFont, CR_GREY, promptwidth, y, (char *)(ChatQueue + i), DTA_CleanNoMove, active_con_scaletext() == 0, TAG_DONE);
		}
		else
		{
			screen->DrawText (SmallFont, CR_GREEN, 0, y, prompt, 
				DTA_VirtualWidth, screen_width, DTA_VirtualHeight, screen_height, DTA_KeepRatio, true, TAG_DONE);
			screen->DrawText (SmallFont, CR_GREY, promptwidth, y, (char *)(ChatQueue + i), 
				DTA_VirtualWidth, screen_width, DTA_VirtualHeight, screen_height, DTA_KeepRatio, true, TAG_DONE);
		}
		ChatQueue[len] = '\0';

		BorderTopRefresh = screen->GetPageCount ();
	}

	if (players[consoleplayer].camera != NULL &&
		(Button_ShowScores.bDown ||
		 players[consoleplayer].camera->health <= 0 ||
		 SB_ForceActive) &&
		 // Don't draw during intermission, since it has its own scoreboard in wi_stuff.cpp.
		 gamestate != GS_INTERMISSION)
	{
		HU_DrawScores (&players[consoleplayer]);
	}
}